

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

string * bloaty::anon_unknown_33::LeftPad(string *input,size_t size)

{
  char *pcVar1;
  char *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *ret;
  string local_40 [32];
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  
  uVar2 = 0;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  while (pcVar1 = (char *)std::__cxx11::string::size(), pcVar1 < in_RDX) {
    std::operator+(in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar2,in_stack_ffffffffffffffe0));
    std::__cxx11::string::operator=((string *)in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return in_RDI;
}

Assistant:

std::string LeftPad(const std::string& input, size_t size) {
  std::string ret = input;
  while (ret.size() < size) {
    ret = " " + ret;
  }

  return ret;
}